

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlChar * xmlXPathParseLiteral(xmlXPathParserContextPtr ctxt)

{
  byte *pbVar1;
  xmlChar *pxVar2;
  uint uVar3;
  int error;
  byte *pbVar4;
  
  pbVar1 = ctxt->cur;
  pbVar4 = pbVar1;
  if (*pbVar1 == 0x27) {
LAB_001e71b0:
    do {
      pbVar4 = pbVar4 + 1;
      ctxt->cur = pbVar4;
      do {
        uVar3 = (uint)*pbVar4;
        if (*pbVar4 < 0x20) {
          if ((0xd < uVar3) || ((0x2600U >> (uVar3 & 0x1f) & 1) == 0)) goto LAB_001e71fd;
          goto LAB_001e71b0;
        }
      } while (uVar3 == 0);
    } while (uVar3 != 0x27);
  }
  else {
    if (*pbVar1 != 0x22) {
      error = 3;
      goto LAB_001e71f4;
    }
LAB_001e7180:
    do {
      pbVar4 = pbVar4 + 1;
      ctxt->cur = pbVar4;
      do {
        uVar3 = (uint)*pbVar4;
        if (*pbVar4 < 0x20) {
          if ((0xd < uVar3) || ((0x2600U >> (uVar3 & 0x1f) & 1) == 0)) goto LAB_001e71fd;
          goto LAB_001e7180;
        }
      } while (uVar3 == 0);
    } while (uVar3 != 0x22);
  }
  pxVar2 = xmlStrndup(pbVar1 + 1,(int)pbVar4 - (int)(pbVar1 + 1));
  if (*ctxt->cur == '\0') {
    return pxVar2;
  }
  ctxt->cur = ctxt->cur + 1;
  return pxVar2;
LAB_001e71fd:
  error = 2;
LAB_001e71f4:
  xmlXPathErr(ctxt,error);
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlXPathParseLiteral(xmlXPathParserContextPtr ctxt) {
    const xmlChar *q;
    xmlChar *ret = NULL;

    if (CUR == '"') {
        NEXT;
	q = CUR_PTR;
	while ((IS_CHAR_CH(CUR)) && (CUR != '"'))
	    NEXT;
	if (!IS_CHAR_CH(CUR)) {
	    XP_ERRORNULL(XPATH_UNFINISHED_LITERAL_ERROR);
	} else {
	    ret = xmlStrndup(q, CUR_PTR - q);
	    NEXT;
        }
    } else if (CUR == '\'') {
        NEXT;
	q = CUR_PTR;
	while ((IS_CHAR_CH(CUR)) && (CUR != '\''))
	    NEXT;
	if (!IS_CHAR_CH(CUR)) {
	    XP_ERRORNULL(XPATH_UNFINISHED_LITERAL_ERROR);
	} else {
	    ret = xmlStrndup(q, CUR_PTR - q);
	    NEXT;
        }
    } else {
	XP_ERRORNULL(XPATH_START_LITERAL_ERROR);
    }
    return(ret);
}